

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# costas.cc
# Opt level: O3

void __thiscall Costas::work(Costas *this,size_t nsamples,complex<float> *fi,complex<float> *fo)

{
  size_t j_2;
  size_t j;
  long lVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  _ComplexT _Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  complex<float> sincos [4];
  float local_68 [14];
  
  if (nsamples != 0) {
    fVar4 = this->phase_;
    fVar3 = this->freq_;
    uVar2 = 0;
    do {
      local_68[8] = -(fVar3 * 0.0 + fVar4);
      local_68[9] = -(fVar4 + fVar3);
      local_68[10] = -(fVar3 * 2.0 + fVar4);
      local_68[0xb] = -(fVar3 * 3.0 + fVar4);
      local_68[4] = 0.0;
      local_68[5] = 0.0;
      local_68[6] = 0.0;
      local_68[7] = 0.0;
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      local_68[3] = 0.0;
      lVar1 = 0;
      do {
        fVar4 = local_68[lVar1 + 8];
        fVar3 = cosf(fVar4);
        local_68[lVar1 * 2] = fVar3;
        fVar4 = sinf(fVar4);
        local_68[lVar1 * 2 + 1] = fVar4;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 4);
      lVar1 = 0;
      do {
        fVar6 = (float)*(undefined8 *)(local_68 + lVar1 * 2);
        fVar7 = (float)((ulong)*(undefined8 *)(local_68 + lVar1 * 2) >> 0x20);
        fVar8 = (float)fi[lVar1]._M_value;
        fVar9 = (float)(fi[lVar1]._M_value >> 0x20);
        fVar4 = fVar6 * fVar8 - fVar7 * fVar9;
        fVar3 = fVar8 * fVar7 + fVar9 * fVar6;
        _Var5 = CONCAT44(fVar3,fVar4);
        if ((NAN(fVar4)) && (_Var5 = CONCAT44(fVar3,fVar4), NAN(fVar3))) {
          _Var5 = __mulsc3(fVar8,fVar9,fVar6,CONCAT44(fVar7,fVar7));
        }
        fo[lVar1]._M_value = _Var5;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 4);
      fVar4 = 0.0;
      lVar1 = 0;
      do {
        fVar3 = *(float *)&fo[lVar1]._M_value * *(float *)((long)&fo[lVar1]._M_value + 4);
        fVar4 = fVar4 + (ABS(fVar3 + 1.0) - ABS(fVar3 + -1.0)) * 0.5 * 0.25;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 4);
      fVar3 = this->beta_ * fVar4 + this->freq_;
      fVar4 = fVar4 * this->alpha_ + fVar3 + this->phase_;
      this->phase_ = fVar4;
      fVar3 = (ABS(fVar3 + this->maxDeviation_) - ABS(fVar3 - this->maxDeviation_)) * 0.5;
      this->freq_ = fVar3;
      if (6.2831855 < ABS(fVar4)) {
        fVar4 = (fVar4 * 0.15915494 - (float)(int)(fVar4 * 0.15915494)) * 6.2831855;
        this->phase_ = fVar4;
      }
      uVar2 = uVar2 + 4;
      fi = fi + 4;
      fo = fo + 4;
    } while (uVar2 < nsamples);
  }
  return;
}

Assistant:

void Costas::work(
    size_t nsamples,
    std::complex<float>* fi,
    std::complex<float>* fo) {
  for (size_t i = 0; i < nsamples; i += 4) {
    float phase[4] = {
      -(phase_ + 0 * freq_),
      -(phase_ + 1 * freq_),
      -(phase_ + 2 * freq_),
      -(phase_ + 3 * freq_),
    };

    // Compute sin/cos for phase offset
    std::complex<float> sincos[4];
    for (size_t j = 0; j < 4; j++) {
      sincos[j].real(cosf(phase[j]));
      sincos[j].imag(sinf(phase[j]));
    }

    // Complex multiplication
    for (size_t j = 0; j < 4; j++) {
      fo[i + j] = fi[i + j] * sincos[j];
    }

    // Phase detector is executed for all samples,
    // Clip resulting value to [-1.0f, 1.0f].
    // Total error is average of 4 errors.
    float terr = 0.0f;
    for (size_t j = 0; j < 4; j++) {
      float err = fo[i + j].real() * fo[i + j].imag();
      terr += (0.5f * (fabsf(err + 1.0f) - fabsf(err - 1.0f))) / 4.0f;
    }

    // Update frequency and phase
    freq_ += beta_ * terr;
    phase_ += alpha_ * terr + freq_;

    // Clamp frequency
    freq_ = (0.5f * (fabsf(freq_ + maxDeviation_) -
                     fabsf(freq_ - maxDeviation_)));

    // Wrap phase if needed
    if (phase_ > M_2PI || phase_ < -M_2PI) {
      float frac = phase_ * (1.0 / M_2PI);
      phase_ = (frac - (float)((int)frac)) * M_2PI;
    }
  }
}